

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O1

void __thiscall re2c::Cond::Cond(Cond *this,string *cmp,uint32_t val)

{
  pointer pcVar1;
  
  (this->compare)._M_dataplus._M_p = (pointer)&(this->compare).field_2;
  pcVar1 = (cmp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + cmp->_M_string_length);
  this->value = val;
  return;
}

Assistant:

Cond::Cond (const std::string & cmp, uint32_t val)
	: compare (cmp)
	, value (val)
{}